

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O0

void __thiscall
QGridLayout::addLayout
          (QGridLayout *this,QLayout *layout,int row,int column,int rowSpan,int columnSpan,
          Alignment alignment)

{
  long lVar1;
  bool bVar2;
  QGridBox *this_00;
  undefined4 in_EDX;
  long in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QGridBox *b;
  QGridLayoutPrivate *d;
  QFlagsStorage<Qt::AlignmentFlag> in_stack_ffffffffffffff7c;
  QLayout *in_stack_ffffffffffffff88;
  QLayout *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QLayoutPrivate *in_stack_ffffffffffffffa0;
  QLayoutItem *local_50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QGridLayout *)0x336062);
  bVar2 = QLayoutPrivate::checkLayout
                    (in_stack_ffffffffffffffa0,
                     (QLayout *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if ((bVar2) &&
     (bVar2 = QLayout::adoptLayout(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88), bVar2)) {
    this_00 = (QGridBox *)operator_new(0x18);
    local_50 = (QLayoutItem *)0x0;
    if (in_RSI != 0) {
      local_50 = (QLayoutItem *)(in_RSI + 0x10);
    }
    QGridBox::QGridBox(this_00,local_50);
    QGridBox::setAlignment((QGridBox *)0x3360fa,(Alignment)in_stack_ffffffffffffff7c.i);
    QGridLayoutPrivate::add
              ((QGridLayoutPrivate *)CONCAT44(in_EDX,in_stack_ffffffffffffff98),this_00,
               (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGridLayout::addLayout(QLayout *layout, int row, int column,
                                      int rowSpan, int columnSpan, Qt::Alignment alignment)
{
    Q_D(QGridLayout);
    if (!d->checkLayout(layout))
        return;
    if (!adoptLayout(layout))
        return;
    QGridBox *b = new QGridBox(layout);
    b->setAlignment(alignment);
    d->add(b, row, (rowSpan < 0) ? -1 : row + rowSpan - 1, column, (columnSpan < 0) ? -1 : column + columnSpan - 1);
}